

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

void __thiscall GGSock::Communicator::Data::doSend(Data *this)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  iVar5 = this->rbHead;
  uVar7 = (uint)(this->ringBufferSend)._M_elems[iVar5]._M_string_length;
  uVar6 = 0;
  do {
    while( true ) {
      if ((ulong)uVar7 == 0) goto LAB_0010ffdc;
      sVar3 = ::send(this->sdpeer,(this->ringBufferSend)._M_elems[iVar5]._M_dataplus._M_p + uVar6,
                     (ulong)uVar7,0);
      iVar2 = (int)sVar3;
      if (-1 < iVar2) break;
      bVar1 = anon_unknown.dwarf_7a85::e_wouldBlock();
      if (!bVar1) {
        this->isConnected = false;
        anon_unknown.dwarf_7a85::closeAndReset(&this->sdpeer);
        anon_unknown.dwarf_7a85::closeAndReset(&this->sd);
        if ((this->errorCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          piVar4 = __errno_location();
          std::function<void_(short)>::operator()(&this->errorCallback,(short)*piVar4);
        }
LAB_0010ffdc:
        iVar5 = 0;
        if (this->rbHead < 0x7f) {
          iVar5 = this->rbHead + 1;
        }
        this->rbHead = iVar5;
        return;
      }
    }
    uVar7 = uVar7 - iVar2;
    uVar6 = uVar6 + iVar2;
  } while( true );
}

Assistant:

void doSend() {
            const auto & curMessage = ringBufferSend[rbHead];
            TBufferSize size = (TBufferSize) curMessage.size();

            int offset = 0;
            while (size > 0) {
                int rc = (int) ::send(sdpeer, curMessage.data() + offset, size, 0);
                if (rc < 0) {
                    if (e_wouldBlock() == false) {
                        isConnected = false;
                        ::closeAndReset(sdpeer);
                        ::closeAndReset(sd);

                        if (errorCallback) {
                            TErrorCode errorCode = errno;
                            errorCallback(errorCode);
                        }

                        break;
                    }
                    continue;
                }
                size -= rc;
                offset += rc;
            }

            if (++rbHead >= (int) ringBufferSend.size()) {
                rbHead = 0;
            }
        }